

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  int local_84;
  uint local_80;
  secp256k1_scalar s;
  
  if (wnaf == (int *)0x0) {
    pcVar6 = "test condition failed: wnaf != NULL";
    uVar4 = 0xa9;
  }
  else if (a == (secp256k1_scalar *)0x0) {
    pcVar6 = "test condition failed: a != NULL";
    uVar4 = 0xab;
  }
  else {
    if (1 < w) {
      iVar5 = 0;
      memset(wnaf,0,(ulong)(uint)len * 4);
      s.d[0] = a->d[0];
      s.d[1] = a->d[1];
      s.d[2] = a->d[2];
      s.d[3] = a->d[3];
      local_84 = 1;
      uVar1 = secp256k1_scalar_get_bits_limb32(&s,0xff,1);
      if (uVar1 != 0) {
        secp256k1_scalar_negate(&s,&s);
        local_84 = -1;
      }
      uVar1 = 0;
      local_80 = 0xffffffff;
      do {
        uVar8 = (ulong)iVar5;
        iVar5 = len - iVar5;
        while( true ) {
          uVar7 = (uint)uVar8;
          if (len <= (int)uVar7) {
            if (uVar1 == 0) {
              do {
                uVar7 = (uint)uVar8;
                if (0xff < (int)uVar7) {
                  return local_80 + 1;
                }
                uVar1 = secp256k1_scalar_get_bits_limb32(&s,uVar7,1);
                uVar8 = (ulong)(uVar7 + 1);
              } while (uVar1 == 0);
              pcVar6 = 
              "test condition failed: secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0";
              uVar4 = 0xd4;
            }
            else {
              pcVar6 = "test condition failed: carry == 0";
              uVar4 = 0xd1;
            }
            goto LAB_0012fe8f;
          }
          uVar2 = secp256k1_scalar_get_bits_limb32(&s,uVar7,1);
          if (uVar2 != uVar1) break;
          uVar8 = uVar8 + 1;
          iVar5 = iVar5 + -1;
        }
        uVar3 = len - uVar7;
        if (w <= (int)(len - uVar7)) {
          uVar3 = w;
        }
        uVar2 = secp256k1_scalar_get_bits_var(&s,uVar7,uVar3);
        uVar3 = uVar2 + uVar1;
        bVar9 = (uVar3 >> (w - 1U & 0x1f) & 1) != 0;
        uVar1 = (uint32_t)bVar9;
        wnaf[uVar8] = (uVar3 - ((uint)bVar9 << ((byte)w & 0x1f))) * local_84;
        if (w < iVar5) {
          iVar5 = w;
        }
        iVar5 = iVar5 + uVar7;
        local_80 = uVar7;
      } while( true );
    }
    pcVar6 = "test condition failed: 2 <= w && w <= 31";
    uVar4 = 0xac;
  }
LAB_0012fe8f:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
          ,uVar4,pcVar6);
  abort();
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}